

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O1

void * deAlignedMalloc(size_t numBytes,size_t alignBytes)

{
  int iVar1;
  void *pvVar2;
  void *ptr;
  void *local_10;
  
  local_10 = (void *)0x0;
  iVar1 = posix_memalign(&local_10,alignBytes + 7 & 0xfffffffffffffff8,numBytes);
  pvVar2 = (void *)0x0;
  if (iVar1 == 0) {
    pvVar2 = local_10;
  }
  return pvVar2;
}

Assistant:

void* deAlignedMalloc (size_t numBytes, size_t alignBytes)
{
#if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_POSIX)
	/* posix_memalign() requires that alignment must be 2^N * sizeof(void*) */
	const size_t	ptrAlignedAlign	= deAlignSize(alignBytes, sizeof(void*));
	void*			ptr				= DE_NULL;

	DE_ASSERT(deIsPowerOfTwoSize(alignBytes) && deIsPowerOfTwoSize(ptrAlignedAlign / sizeof(void*)));

	if (posix_memalign(&ptr, ptrAlignedAlign, numBytes) == 0)
	{
		DE_ASSERT(ptr);
		return ptr;
	}
	else
	{
		DE_ASSERT(!ptr);
		return DE_NULL;
	}

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_WIN32)
	DE_ASSERT(deIsPowerOfTwoSize(alignBytes));

	return _aligned_malloc(numBytes, alignBytes);

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC)
	void* const	basePtr	= deMalloc(numBytes + alignBytes + sizeof(AlignedAllocHeader));

	DE_ASSERT(deIsPowerOfTwoSize(alignBytes));

	if (basePtr)
	{
		void* const					alignedPtr	= deAlignPtr((void*)((deUintptr)basePtr + sizeof(AlignedAllocHeader)), alignBytes);
		AlignedAllocHeader* const	hdr			= getAlignedAllocHeader(alignedPtr);

		hdr->basePtr	= basePtr;
		hdr->numBytes	= numBytes;

		return alignedPtr;
	}
	else
		return DE_NULL;
#else
#	error "Invalid DE_ALIGNED_MALLOC"
#endif
}